

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliY.cpp
# Opt level: O2

void __thiscall
qclab::qgates::PauliY<std::complex<float>_>::apply
          (PauliY<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  anon_class_24_3_f49331b9 f;
  anon_class_24_3_f49331b9 local_38;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[3])();
  local_38.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38.lambda1._M_value._4_4_ = 0xbf800000;
  if (op == Trans) {
    local_38.lambda1._M_value._4_4_ = 0x3f800000;
  }
  local_38.lambda2._M_value._4_4_ = (uint)(op != Trans) * -0x80000000 + -0x40800000;
  local_38.lambda1._M_value._0_4_ = 0;
  local_38.lambda2._M_value._0_4_ = 0;
  apply2<qclab::qgates::lambda_PauliY<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,offset + iVar1,&local_38);
  return;
}

Assistant:

void PauliY< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_PauliY( op , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }